

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

void __thiscall FWriter::~FWriter(FWriter *this)

{
  Writer *pWVar1;
  PrettyWriter *pPVar2;
  
  pWVar1 = this->mWriter1;
  if (pWVar1 != (Writer *)0x0) {
    free((pWVar1->level_stack_).stack_);
    operator_delete((pWVar1->level_stack_).ownAllocator_,1);
    operator_delete(pWVar1,0x40);
  }
  pPVar2 = this->mWriter2;
  if (pPVar2 != (PrettyWriter *)0x0) {
    free((pPVar2->
         super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         ).level_stack_.stack_);
    operator_delete((pPVar2->
                    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    ).level_stack_.ownAllocator_,1);
    operator_delete(pPVar2,0x48);
  }
  TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::~TMap(&this->mObjectMap);
  TArray<DObject_*,_DObject_*>::~TArray(&this->mDObjects);
  free((this->mOutString).stack_.stack_);
  operator_delete((this->mOutString).stack_.ownAllocator_,1);
  TArray<bool,_bool>::~TArray(&this->mInObject);
  return;
}

Assistant:

~FWriter()
	{
		if (mWriter1) delete mWriter1;
		if (mWriter2) delete mWriter2;
	}